

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.cpp
# Opt level: O0

void __thiscall
GPIO::GPIOBase::SoftThread::SoftThread
          (SoftThread *this,GPIO_MODE what,uint gpio,uint range,uint value)

{
  undefined8 uVar1;
  GPIOError *this_00;
  uint in_ECX;
  uint in_EDX;
  char in_SIL;
  SoftThread *in_RDI;
  uint in_R8D;
  unique_ptr<std::thread,_std::default_delete<std::thread>_> *in_stack_ffffffffffffff68;
  GPIOError *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff88;
  uint value_00;
  type *in_stack_ffffffffffffff98;
  
  value_00 = (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  std::unique_ptr<std::thread,std::default_delete<std::thread>>::
  unique_ptr<std::default_delete<std::thread>,void>
            ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)in_stack_ffffffffffffff70
            );
  in_RDI->m_range = in_ECX;
  in_RDI->m_value = in_R8D;
  std::atomic<unsigned_int>::atomic((atomic<unsigned_int> *)0x12f693);
  std::atomic<unsigned_int>::atomic((atomic<unsigned_int> *)0x12f6a1);
  in_RDI->m_gpio = in_EDX;
  if (in_RDI->m_range == 0) {
    uVar1 = __cxa_allocate_exception(0x10);
    GPIOError::runtime_error(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    __cxa_throw(uVar1,&GPIOError::typeinfo,GPIOError::~GPIOError);
  }
  if (in_RDI->m_range < in_RDI->m_value) {
    uVar1 = __cxa_allocate_exception(0x10);
    GPIOError::runtime_error(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    __cxa_throw(uVar1,&GPIOError::typeinfo,GPIOError::~GPIOError);
  }
  set_value(in_RDI,value_00);
  if (in_SIL == '\x03') {
    std::make_unique<std::thread,void(GPIO::GPIOBase::SoftThread::*)(),GPIO::GPIOBase::SoftThread*>
              (in_stack_ffffffffffffff98,(SoftThread **)in_RDI);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator=
              ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
              ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)
               in_stack_ffffffffffffff70);
  }
  else {
    if (in_SIL != '\x05') {
      this_00 = (GPIOError *)__cxa_allocate_exception(0x10);
      GPIOError::runtime_error(this_00,(char *)in_stack_ffffffffffffff68);
      __cxa_throw(this_00,&GPIOError::typeinfo,GPIOError::~GPIOError);
    }
    std::make_unique<std::thread,void(GPIO::GPIOBase::SoftThread::*)(),GPIO::GPIOBase::SoftThread*>
              ((type *)in_RDI,(SoftThread **)in_RDI);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator=
              ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
              ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)
               in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

GPIOBase::SoftThread::SoftThread(GPIO_MODE what, unsigned int gpio, unsigned int range, unsigned int value)
: m_range(range)
, m_value(value)
, m_gpio(gpio)
{
    if (m_range == 0) throw GPIOError("range == 0");
    if (m_value > m_range) throw GPIOError("value > range");

    // compute the mark and space values

    set_value(m_value);

    switch (what) {
        case GPIO_MODE::SOFT_PWM_OUTPUT:
            m_thread = std::make_unique<std::thread>(&GPIOBase::SoftThread::run_pwm, this);
            break;
        case GPIO_MODE::SOFT_TONE_OUTPUT:
            m_thread = std::make_unique<std::thread>(&GPIOBase::SoftThread::run_tone, this);
            break;
        default: throw GPIOError("invalid mode");
    }
}